

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void Lowerer::GenerateLdFldFromLocalInlineCache
               (Instr *instrLdFld,RegOpnd *opndBase,Opnd *opndDst,RegOpnd *opndInlineCache,
               LabelInstr *labelFallThru,bool isInlineSlot)

{
  BYTE scale;
  DWORD offset;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar1;
  RegOpnd *indexOpnd;
  undefined3 in_register_00000089;
  
  baseOpnd = opndBase;
  if (CONCAT31(in_register_00000089,isInlineSlot) == 0) {
    baseOpnd = IR::RegOpnd::New(TyInt64,instrLdFld->m_func);
    offset = Js::DynamicObject::GetOffsetOfAuxSlots();
    pIVar1 = IR::IndirOpnd::New(opndBase,offset,TyInt64,instrLdFld->m_func,false);
    InsertMove(&baseOpnd->super_Opnd,&pIVar1->super_Opnd,instrLdFld,true);
  }
  indexOpnd = IR::RegOpnd::New(TyInt64,instrLdFld->m_func);
  pIVar1 = IR::IndirOpnd::New(opndInlineCache,0x12,TyUint16,instrLdFld->m_func,false);
  InsertMove(&indexOpnd->super_Opnd,&pIVar1->super_Opnd,instrLdFld,true);
  scale = LowererMDArch::GetDefaultIndirScale();
  pIVar1 = IR::IndirOpnd::New(baseOpnd,indexOpnd,scale,TyInt64,instrLdFld->m_func);
  InsertMove(opndDst,&pIVar1->super_Opnd,instrLdFld,true);
  InsertBranch(Br,false,labelFallThru,instrLdFld);
  return;
}

Assistant:

void
Lowerer::GenerateLdFldFromLocalInlineCache(
    IR::Instr * instrLdFld,
    IR::RegOpnd * opndBase,
    IR::Opnd * opndDst,
    IR::RegOpnd * opndInlineCache,
    IR::LabelInstr * labelFallThru,
    bool isInlineSlot)
{
    // Generate:
    //
    // s1 = MOV base->slots -- load the slot array
    // s2 = MOVZXw [&(inlineCache->u.local.slotIndex)] -- load the cached slot index
    // dst = MOV [s1 + s2 * Scale]  -- load the value directly from the slot
    //      JMP $fallthru

    IR::IndirOpnd * opndIndir = nullptr;
    IR::RegOpnd * opndSlotArray = nullptr;

    if (!isInlineSlot)
    {
        opndSlotArray = IR::RegOpnd::New(TyMachReg, instrLdFld->m_func);
        opndIndir = IR::IndirOpnd::New(opndBase, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachReg, instrLdFld->m_func);
        InsertMove(opndSlotArray, opndIndir, instrLdFld);
    }

    // s2 = MOVZXw [&(inlineCache->u.local.slotIndex)] -- load the cached slot index
    IR::RegOpnd * opndReg2 = IR::RegOpnd::New(TyMachReg, instrLdFld->m_func);
    opndIndir = IR::IndirOpnd::New(opndInlineCache, (int32)offsetof(Js::InlineCache, u.local.slotIndex), TyUint16, instrLdFld->m_func);
    InsertMove(opndReg2, opndIndir, instrLdFld);

    if (isInlineSlot)
    {
        // dst = MOV [base + s2 * Scale]  -- load the value directly from the slot
        opndIndir = IR::IndirOpnd::New(opndBase, opndReg2, LowererMD::GetDefaultIndirScale(), TyMachReg, instrLdFld->m_func);
        InsertMove(opndDst, opndIndir, instrLdFld);
    }
    else
    {
        // dst = MOV [s1 + s2 * Scale]  -- load the value directly from the slot
        opndIndir = IR::IndirOpnd::New(opndSlotArray, opndReg2, LowererMD::GetDefaultIndirScale(), TyMachReg, instrLdFld->m_func);
        InsertMove(opndDst, opndIndir, instrLdFld);
    }

    // JMP $fallthru
    InsertBranch(Js::OpCode::Br, labelFallThru, instrLdFld);
}